

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration>::reallocateAndGrow
          (QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *this,
          GrowthPosition where,qsizetype n,
          QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *old)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  undefined1 *puVar3;
  QString *pQVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  QString *pQVar7;
  qsizetype qVar8;
  NamespaceDeclaration *data;
  long lVar9;
  NamespaceDeclaration *pNVar10;
  NamespaceDeclaration *pNVar11;
  NamespaceDeclaration *pNVar12;
  long in_FS_OFFSET;
  QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)0x0 &&
         where == GrowsAtEnd) && (pDVar1 = this->d, pDVar1 != (Data *)0x0)) && (0 < n)) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QtPrivate::QMovableArrayOps<QXmlStreamPrivateTagStack::NamespaceDeclaration>::reallocate
                ((QMovableArrayOps<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)this,
                 n + this->size +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 4) * -0x5555555555555555,Grow);
      return;
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (NamespaceDeclaration *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    if (local_48.ptr == (NamespaceDeclaration *)0x0 && 0 < n) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        qBadAlloc();
      }
    }
    else {
      if (this->size != 0) {
        lVar9 = this->size + (n >> 0x3f & n);
        if (((this->d == (Data *)0x0) ||
            (old != (QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)0x0)) ||
           (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          if (0 < lVar9) {
            pNVar10 = this->ptr;
            pNVar11 = pNVar10 + lVar9;
            pNVar12 = local_48.ptr + local_48.size;
            do {
              pQVar4 = (pNVar10->prefix).m_string;
              qVar5 = (pNVar10->prefix).m_pos;
              qVar6 = (pNVar10->prefix).m_size;
              pQVar7 = (pNVar10->namespaceUri).m_string;
              qVar8 = (pNVar10->namespaceUri).m_size;
              (pNVar12->namespaceUri).m_pos = (pNVar10->namespaceUri).m_pos;
              (pNVar12->namespaceUri).m_size = qVar8;
              (pNVar12->prefix).m_size = qVar6;
              (pNVar12->namespaceUri).m_string = pQVar7;
              (pNVar12->prefix).m_string = pQVar4;
              (pNVar12->prefix).m_pos = qVar5;
              pNVar10 = pNVar10 + 1;
              local_48.size = local_48.size + 1;
              pNVar12 = pNVar12 + 1;
            } while (pNVar10 < pNVar11);
          }
        }
        else if (0 < lVar9) {
          pNVar10 = this->ptr;
          pNVar11 = pNVar10 + lVar9;
          pNVar12 = local_48.ptr + local_48.size;
          do {
            pQVar4 = (pNVar10->prefix).m_string;
            qVar5 = (pNVar10->prefix).m_pos;
            qVar6 = (pNVar10->prefix).m_size;
            pQVar7 = (pNVar10->namespaceUri).m_string;
            qVar8 = (pNVar10->namespaceUri).m_size;
            (pNVar12->namespaceUri).m_pos = (pNVar10->namespaceUri).m_pos;
            (pNVar12->namespaceUri).m_size = qVar8;
            (pNVar12->prefix).m_size = qVar6;
            (pNVar12->namespaceUri).m_string = pQVar7;
            (pNVar12->prefix).m_string = pQVar4;
            (pNVar12->prefix).m_pos = qVar5;
            pNVar10 = pNVar10 + 1;
            local_48.size = local_48.size + 1;
            pNVar12 = pNVar12 + 1;
          } while (pNVar10 < pNVar11);
        }
      }
      pQVar2 = &this->d->super_QArrayData;
      this->d = local_48.d;
      pNVar10 = this->ptr;
      this->ptr = local_48.ptr;
      puVar3 = (undefined1 *)this->size;
      this->size = local_48.size;
      local_48.d = (Data *)pQVar2;
      local_48.ptr = pNVar10;
      local_48.size = (qsizetype)puVar3;
      if (old != (QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)0x0) {
        local_48.d = old->d;
        old->d = (Data *)pQVar2;
        local_48.ptr = old->ptr;
        old->ptr = pNVar10;
        local_48.size = old->size;
        old->size = (qsizetype)puVar3;
      }
      if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d)->super_QArrayData,0x30,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }